

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O3

OPJ_BOOL opj_t2_encode_packets
                   (opj_t2_t *p_t2,OPJ_UINT32 p_tile_no,opj_tcd_tile_t *p_tile,
                   OPJ_UINT32 p_maxlayers,OPJ_BYTE *p_dest,OPJ_UINT32 *p_data_written,
                   OPJ_UINT32 p_max_len,opj_codestream_info_t *cstr_info,
                   opj_tcd_marker_info_t *p_marker_info,OPJ_UINT32 p_tp_num,OPJ_INT32 p_tp_pos,
                   OPJ_UINT32 p_pino,J2K_T2_MODE p_t2_mode,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  uint uVar2;
  opj_image_t *p_image;
  uint uVar3;
  ulong uVar4;
  OPJ_UINT32 OVar5;
  int iVar6;
  OPJ_BOOL OVar7;
  OPJ_BOOL OVar8;
  opj_pi_iterator_t *poVar9;
  OPJ_UINT32 *pOVar10;
  undefined8 uVar11;
  long lVar12;
  opj_packet_info_t *poVar13;
  OPJ_UINT32 l_comp_len;
  uint uVar14;
  OPJ_UINT32 local_80;
  uint local_7c;
  opj_cp_t *local_78;
  opj_pi_iterator_t *local_70;
  OPJ_UINT32 local_68;
  uint local_64;
  opj_tcp_t *local_60;
  ulong local_58;
  long local_50;
  OPJ_UINT32 *local_48;
  opj_tcd_tile_t *local_40;
  OPJ_UINT32 local_34;
  
  p_image = p_t2->image;
  local_78 = p_t2->cp;
  local_58 = (ulong)p_tile_no;
  local_60 = local_78->tcps + local_58;
  if ((local_78->m_specific_param).m_dec.m_reduce == 0) {
    OVar5 = 1;
  }
  else {
    OVar5 = p_image->numcomps;
  }
  local_50 = CONCAT62(local_50._2_6_,local_78->rsiz);
  OVar1 = local_60->numpocs;
  local_64 = p_maxlayers;
  local_48 = p_data_written;
  local_40 = p_tile;
  poVar9 = opj_pi_initialise_encode(p_image,local_78,p_tile_no,p_t2_mode,p_manager);
  uVar3 = local_64;
  if (poVar9 == (opj_pi_iterator_t *)0x0) {
    return 0;
  }
  *local_48 = 0;
  local_70 = poVar9;
  local_68 = OVar5;
  local_34 = OVar1;
  if (p_t2_mode == THRESH_CALC) {
    if (OVar5 != 0) {
      local_7c = 0;
      pOVar10 = local_48;
      do {
        uVar11 = CONCAT71((int7)((ulong)pOVar10 >> 8),1);
        uVar14 = 0;
        OVar5 = 0;
        poVar9 = local_70;
        do {
          local_58 = CONCAT44(local_58._4_4_,(int)uVar11);
          opj_pi_create_encode(local_70,local_78,p_tile_no,OVar5,local_7c,p_tp_pos,THRESH_CALC);
          OVar8 = 0;
          if ((poVar9->poc).prg == OPJ_PROG_UNKNOWN) goto LAB_0013f125;
          while (OVar8 = opj_pi_next(poVar9), OVar8 != 0) {
            if (poVar9->layno < uVar3) {
              OVar8 = 0;
              local_80 = 0;
              OVar7 = opj_t2_encode_packet
                                (p_tile_no,local_40,local_60,poVar9,p_dest,&local_80,p_max_len,
                                 cstr_info,THRESH_CALC,p_manager);
              if (OVar7 == 0) goto LAB_0013f125;
              uVar14 = uVar14 + local_80;
              p_dest = p_dest + local_80;
              p_max_len = p_max_len - local_80;
              *local_48 = *local_48 + local_80;
            }
          }
          uVar2 = (local_78->m_specific_param).m_dec.m_reduce;
          if ((uVar2 != 0) && (OVar8 = 0, uVar2 < uVar14)) goto LAB_0013f125;
          poVar9 = poVar9 + 1;
          OVar5 = 1;
          uVar11 = 0;
        } while (((byte)local_58 & (short)local_50 == 4) != 0);
        local_7c = local_7c + 1;
        pOVar10 = (OPJ_UINT32 *)(ulong)local_7c;
        OVar8 = 1;
      } while (local_7c != local_68);
      goto LAB_0013f125;
    }
  }
  else {
    opj_pi_create_encode(poVar9,local_78,p_tile_no,p_pino,p_tp_num,p_tp_pos,p_t2_mode);
    uVar3 = local_64;
    lVar12 = (ulong)p_pino * 0x100;
    OVar8 = 0;
    if (local_70[p_pino].poc.prg == OPJ_PROG_UNKNOWN) goto LAB_0013f125;
    if ((p_marker_info != (opj_tcd_marker_info_t *)0x0) && (p_marker_info->need_PLT != 0)) {
      if (p_marker_info->packet_count != 0) {
        __assert_fail("p_marker_info->packet_count == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/t2.c"
                      ,0x13d,
                      "OPJ_BOOL opj_t2_encode_packets(opj_t2_t *, OPJ_UINT32, opj_tcd_tile_t *, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32, opj_codestream_info_t *, opj_tcd_marker_info_t *, OPJ_UINT32, OPJ_INT32, OPJ_UINT32, J2K_T2_MODE, opj_event_mgr_t *)"
                     );
      }
      local_50 = lVar12;
      if (p_marker_info->p_packet_size != (OPJ_UINT32 *)0x0) {
        __assert_fail("p_marker_info->p_packet_size == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/t2.c"
                      ,0x13e,
                      "OPJ_BOOL opj_t2_encode_packets(opj_t2_t *, OPJ_UINT32, opj_tcd_tile_t *, OPJ_UINT32, OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32, opj_codestream_info_t *, opj_tcd_marker_info_t *, OPJ_UINT32, OPJ_INT32, OPJ_UINT32, J2K_T2_MODE, opj_event_mgr_t *)"
                     );
      }
      OVar5 = opj_get_encoding_packet_count(p_image,local_78,p_tile_no);
      pOVar10 = (OPJ_UINT32 *)opj_malloc((ulong)OVar5 << 2);
      p_marker_info->p_packet_size = pOVar10;
      lVar12 = local_50;
      if (pOVar10 == (OPJ_UINT32 *)0x0) goto LAB_0013f125;
    }
    poVar9 = (opj_pi_iterator_t *)((poVar9->poc).progorder + lVar12 + -0x60);
    iVar6 = opj_pi_next(poVar9);
    uVar4 = local_58;
    while (iVar6 != 0) {
      if (poVar9->layno < uVar3) {
        local_80 = 0;
        OVar7 = opj_t2_encode_packet
                          (p_tile_no,local_40,local_60,poVar9,p_dest,&local_80,p_max_len,cstr_info,
                           p_t2_mode,p_manager);
        if (OVar7 == 0) goto LAB_0013f125;
        *local_48 = *local_48 + local_80;
        if ((p_marker_info != (opj_tcd_marker_info_t *)0x0) && (p_marker_info->need_PLT != 0)) {
          p_marker_info->p_packet_size[p_marker_info->packet_count] = local_80;
          p_marker_info->packet_count = p_marker_info->packet_count + 1;
        }
        if (cstr_info != (opj_codestream_info_t *)0x0) {
          iVar6 = cstr_info->packno;
          if (cstr_info->index_write != 0) {
            poVar13 = cstr_info->tile[uVar4].packet + iVar6;
            if (iVar6 == 0) {
              lVar12 = (long)cstr_info->tile[uVar4].end_header;
LAB_0013efb1:
              lVar12 = lVar12 + 1;
            }
            else if (((((byte)local_60->field_0x1638 >> 2 |
                       *(byte *)((long)&local_78->m_specific_param + 0x18)) & 1) == 0) ||
                    (lVar12 = poVar13->start_pos, lVar12 == 0)) {
              lVar12 = poVar13[-1].end_pos;
              goto LAB_0013efb1;
            }
            poVar13->start_pos = lVar12;
            poVar13->end_pos = (ulong)local_80 + lVar12 + -1;
            poVar13->end_ph_pos = lVar12 + poVar13->end_ph_pos + -1;
          }
          cstr_info->packno = iVar6 + 1;
        }
        p_dest = p_dest + local_80;
        p_max_len = p_max_len - local_80;
        local_40->packno = local_40->packno + 1;
      }
      iVar6 = opj_pi_next(poVar9);
    }
  }
  OVar8 = 1;
LAB_0013f125:
  opj_pi_destroy(local_70,local_34 + 1);
  return OVar8;
}

Assistant:

OPJ_BOOL opj_t2_encode_packets(opj_t2_t* p_t2,
                               OPJ_UINT32 p_tile_no,
                               opj_tcd_tile_t *p_tile,
                               OPJ_UINT32 p_maxlayers,
                               OPJ_BYTE *p_dest,
                               OPJ_UINT32 * p_data_written,
                               OPJ_UINT32 p_max_len,
                               opj_codestream_info_t *cstr_info,
                               opj_tcd_marker_info_t* p_marker_info,
                               OPJ_UINT32 p_tp_num,
                               OPJ_INT32 p_tp_pos,
                               OPJ_UINT32 p_pino,
                               J2K_T2_MODE p_t2_mode,
                               opj_event_mgr_t *p_manager)
{
    OPJ_BYTE *l_current_data = p_dest;
    OPJ_UINT32 l_nb_bytes = 0;
    OPJ_UINT32 compno;
    OPJ_UINT32 poc;
    opj_pi_iterator_t *l_pi = 00;
    opj_pi_iterator_t *l_current_pi = 00;
    opj_image_t *l_image = p_t2->image;
    opj_cp_t *l_cp = p_t2->cp;
    opj_tcp_t *l_tcp = &l_cp->tcps[p_tile_no];
    OPJ_UINT32 pocno = (l_cp->rsiz == OPJ_PROFILE_CINEMA_4K) ? 2 : 1;
    OPJ_UINT32 l_max_comp = l_cp->m_specific_param.m_enc.m_max_comp_size > 0 ?
                            l_image->numcomps : 1;
    OPJ_UINT32 l_nb_pocs = l_tcp->numpocs + 1;

    l_pi = opj_pi_initialise_encode(l_image, l_cp, p_tile_no, p_t2_mode, p_manager);
    if (!l_pi) {
        return OPJ_FALSE;
    }

    * p_data_written = 0;

    if (p_t2_mode == THRESH_CALC) { /* Calculating threshold */
        l_current_pi = l_pi;

        for (compno = 0; compno < l_max_comp; ++compno) {
            OPJ_UINT32 l_comp_len = 0;
            l_current_pi = l_pi;

            for (poc = 0; poc < pocno ; ++poc) {
                OPJ_UINT32 l_tp_num = compno;

                /* TODO MSD : check why this function cannot fail (cf. v1) */
                opj_pi_create_encode(l_pi, l_cp, p_tile_no, poc, l_tp_num, p_tp_pos, p_t2_mode);

                if (l_current_pi->poc.prg == OPJ_PROG_UNKNOWN) {
                    /* TODO ADE : add an error */
                    opj_pi_destroy(l_pi, l_nb_pocs);
                    return OPJ_FALSE;
                }
                while (opj_pi_next(l_current_pi)) {
                    if (l_current_pi->layno < p_maxlayers) {
                        l_nb_bytes = 0;

                        if (! opj_t2_encode_packet(p_tile_no, p_tile, l_tcp, l_current_pi,
                                                   l_current_data, &l_nb_bytes,
                                                   p_max_len, cstr_info,
                                                   p_t2_mode,
                                                   p_manager)) {
                            opj_pi_destroy(l_pi, l_nb_pocs);
                            return OPJ_FALSE;
                        }

                        l_comp_len += l_nb_bytes;
                        l_current_data += l_nb_bytes;
                        p_max_len -= l_nb_bytes;

                        * p_data_written += l_nb_bytes;
                    }
                }

                if (l_cp->m_specific_param.m_enc.m_max_comp_size) {
                    if (l_comp_len > l_cp->m_specific_param.m_enc.m_max_comp_size) {
                        opj_pi_destroy(l_pi, l_nb_pocs);
                        return OPJ_FALSE;
                    }
                }

                ++l_current_pi;
            }
        }
    } else { /* t2_mode == FINAL_PASS  */
        opj_pi_create_encode(l_pi, l_cp, p_tile_no, p_pino, p_tp_num, p_tp_pos,
                             p_t2_mode);

        l_current_pi = &l_pi[p_pino];
        if (l_current_pi->poc.prg == OPJ_PROG_UNKNOWN) {
            /* TODO ADE : add an error */
            opj_pi_destroy(l_pi, l_nb_pocs);
            return OPJ_FALSE;
        }

        if (p_marker_info && p_marker_info->need_PLT) {
            /* One time use intended */
            assert(p_marker_info->packet_count == 0);
            assert(p_marker_info->p_packet_size == NULL);

            p_marker_info->p_packet_size = (OPJ_UINT32*) opj_malloc(
                                               opj_get_encoding_packet_count(l_image, l_cp, p_tile_no) * sizeof(OPJ_UINT32));
            if (p_marker_info->p_packet_size == NULL) {
                opj_pi_destroy(l_pi, l_nb_pocs);
                return OPJ_FALSE;
            }
        }

        while (opj_pi_next(l_current_pi)) {
            if (l_current_pi->layno < p_maxlayers) {
                l_nb_bytes = 0;

                if (! opj_t2_encode_packet(p_tile_no, p_tile, l_tcp, l_current_pi,
                                           l_current_data, &l_nb_bytes, p_max_len,
                                           cstr_info, p_t2_mode, p_manager)) {
                    opj_pi_destroy(l_pi, l_nb_pocs);
                    return OPJ_FALSE;
                }

                l_current_data += l_nb_bytes;
                p_max_len -= l_nb_bytes;

                * p_data_written += l_nb_bytes;

                if (p_marker_info && p_marker_info->need_PLT) {
                    p_marker_info->p_packet_size[p_marker_info->packet_count] = l_nb_bytes;
                    p_marker_info->packet_count ++;
                }

                /* INDEX >> */
                if (cstr_info) {
                    if (cstr_info->index_write) {
                        opj_tile_info_t *info_TL = &cstr_info->tile[p_tile_no];
                        opj_packet_info_t *info_PK = &info_TL->packet[cstr_info->packno];
                        if (!cstr_info->packno) {
                            info_PK->start_pos = info_TL->end_header + 1;
                        } else {
                            info_PK->start_pos = ((l_cp->m_specific_param.m_enc.m_tp_on | l_tcp->POC) &&
                                                  info_PK->start_pos) ? info_PK->start_pos : info_TL->packet[cstr_info->packno -
                                                                            1].end_pos + 1;
                        }
                        info_PK->end_pos = info_PK->start_pos + l_nb_bytes - 1;
                        info_PK->end_ph_pos += info_PK->start_pos -
                                               1;  /* End of packet header which now only represents the distance
                                                                                                                                                                                                                                                   to start of packet is incremented by value of start of packet*/
                    }

                    cstr_info->packno++;
                }
                /* << INDEX */
                ++p_tile->packno;
            }
        }
    }

    opj_pi_destroy(l_pi, l_nb_pocs);

    return OPJ_TRUE;
}